

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World_3df.cpp
# Opt level: O1

void __thiscall
World_3df::breed(World_3df *this,shared_ptr<Population> *param_1,shared_ptr<Population> *dst)

{
  element_type *peVar1;
  long lVar2;
  Population *this_00;
  shared_ptr<Population> *psVar3;
  int iVar4;
  creat_t *pcVar5;
  ulong uVar6;
  char *__function;
  element_type *peVar7;
  size_t val;
  long lVar8;
  Msg local_418;
  Msg local_3e8;
  Msg local_3b8;
  Msg local_388;
  Msg local_358;
  Msg local_328;
  Msg local_2f8;
  Msg local_2c8;
  Msg local_298;
  Msg local_268;
  Msg local_238;
  Msg local_208;
  Msg local_1d8;
  Msg local_1a8;
  Msg local_178;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  element_type *local_68;
  shared_count local_60;
  double local_58;
  double local_50;
  element_type *local_48;
  World_3df *local_40;
  shared_ptr<Population> *local_38;
  
  peVar1 = (this->super_World).LOGFILE.px;
  local_178.msg_txt._M_dataplus._M_p = (pointer)(this->super_World).LOGFILE.pn.pi_;
  if ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ =
         ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ + 1;
    UNLOCK();
  }
  local_178._vptr_Msg = (_func_int **)peVar1;
  local_40 = this;
  if (peVar1 == (element_type *)0x0) {
LAB_00112552:
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,
                  "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<util::logging::File_logger>::operator*() const [T = util::logging::File_logger]"
                 );
  }
  util::logging::Msg::Msg(&local_1a8,anon_var_dwarf_371cc,L_NORM);
  (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_1a8);
  util::logging::Msg::~Msg(&local_1a8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_178.msg_txt);
  if (dst->px != (element_type *)0x0) {
    peVar7 = dst->px;
    local_38 = dst;
    if (peVar7 != (element_type *)0x0) {
      val = dst->px->ELITE_SIZE;
      lVar8 = val << 4;
      do {
        pcVar5 = Population::get_creatures(peVar7);
        psVar3 = local_38;
        if (((long)(pcVar5->
                   super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pcVar5->
                   super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= val) {
          peVar1 = (local_40->super_World).LOGFILE.px;
          local_178.msg_txt._M_dataplus._M_p = (pointer)(local_40->super_World).LOGFILE.pn.pi_;
          if ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p != (sp_counted_base *)0x0) {
            LOCK();
            ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ =
                 ((sp_counted_base *)local_178.msg_txt._M_dataplus._M_p)->use_count_ + 1;
            UNLOCK();
          }
          local_178._vptr_Msg = (_func_int **)peVar1;
          if (peVar1 != (element_type *)0x0) {
            util::logging::Msg::Msg(&local_1a8,anon_var_dwarf_371b6,L_NORM);
            (*(peVar1->super_Ostream_logger).super_Logger._vptr_Logger[3])(peVar1,&local_1a8);
            util::logging::Msg::~Msg(&local_1a8);
            boost::detail::shared_count::~shared_count((shared_count *)&local_178.msg_txt);
            return;
          }
          goto LAB_00112552;
        }
        if (local_38->px == (Population *)0x0) break;
        pcVar5 = Population::get_creatures(local_38->px);
        lVar2 = *(long *)((long)&((pcVar5->
                                  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->px + lVar8);
        if (lVar2 == 0) {
LAB_00112533:
          __function = 
          "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
          ;
          goto LAB_00112548;
        }
        this_00 = psVar3->px;
        if (this_00 == (Population *)0x0) break;
        local_58 = *(double *)(lVar2 + 0x30);
        pcVar5 = Population::get_creatures(this_00);
        lVar2 = *(long *)((long)&(pcVar5->
                                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[1].px + lVar8);
        if (lVar2 == 0) goto LAB_00112533;
        local_50 = *(double *)(lVar2 + 0x30);
        iVar4 = rand();
        peVar7 = psVar3->px;
        if (peVar7 == (element_type *)0x0) break;
        uVar6 = (ulong)((double)iVar4 / 43826196.89795918);
        uVar6 = (long)((double)iVar4 / 43826196.89795918 - 9.223372036854776e+18) &
                (long)uVar6 >> 0x3f | uVar6;
        (*peVar7->_vptr_Population[3])(peVar7,val,val + 1,uVar6);
        local_68 = (local_40->super_World).LOGFILE.px;
        local_60.pi_ = (local_40->super_World).LOGFILE.pn.pi_;
        if (local_60.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_60.pi_)->use_count_ = (local_60.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_48 = local_68;
        if (local_68 == (element_type *)0x0) goto LAB_00112552;
        util::logging::Msg::Msg(&local_358,"... [",L_NORM);
        util::logging::Msg::operator+(&local_1d8,&local_358,val);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"]x[","");
        util::logging::Msg::operator+(&local_388,&local_1d8,&local_148);
        util::logging::Msg::operator+(&local_208,&local_388,val + 1);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"]@","");
        util::logging::Msg::operator+(&local_3b8,&local_208,&local_128);
        util::logging::Msg::operator+(&local_238,&local_3b8,uVar6);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108," = {f1: ","");
        util::logging::Msg::operator+(&local_3e8,&local_238,&local_108);
        util::logging::Msg::operator+(&local_268,&local_3e8,local_58);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8," -> ","");
        util::logging::Msg::operator+(&local_298,&local_268,&local_e8);
        if (local_38->px == (Population *)0x0) break;
        pcVar5 = Population::get_creatures(local_38->px);
        lVar2 = *(long *)((long)&((pcVar5->
                                  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->px + lVar8);
        if (lVar2 == 0) goto LAB_00112533;
        util::logging::Msg::operator+(&local_2c8,&local_298,*(double *)(lVar2 + 0x30));
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"}x{f2: ","");
        util::logging::Msg::operator+(&local_418,&local_2c8,&local_c8);
        util::logging::Msg::operator+(&local_2f8,&local_418,local_50);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8," -> ","");
        util::logging::Msg::operator+(&local_328,&local_2f8,&local_a8);
        if (local_38->px == (Population *)0x0) break;
        pcVar5 = Population::get_creatures(local_38->px);
        lVar2 = *(long *)((long)&(pcVar5->
                                 super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[1].px + lVar8);
        if (lVar2 == 0) goto LAB_00112533;
        util::logging::Msg::operator+(&local_178,&local_328,*(double *)(lVar2 + 0x30));
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"}","");
        util::logging::Msg::operator+(&local_1a8,&local_178,&local_88);
        (*(local_48->super_Ostream_logger).super_Logger._vptr_Logger[3])(local_48,&local_1a8);
        util::logging::Msg::~Msg(&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_178);
        util::logging::Msg::~Msg(&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_2f8);
        util::logging::Msg::~Msg(&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_2c8);
        util::logging::Msg::~Msg(&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_268);
        util::logging::Msg::~Msg(&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_238);
        util::logging::Msg::~Msg(&local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_208);
        util::logging::Msg::~Msg(&local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        util::logging::Msg::~Msg(&local_1d8);
        util::logging::Msg::~Msg(&local_358);
        boost::detail::shared_count::~shared_count(&local_60);
        peVar7 = local_38->px;
        lVar8 = lVar8 + 0x20;
        val = val + 2;
      } while (peVar7 != (element_type *)0x0);
    }
  }
  __function = 
  "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Population>::operator->() const [T = Population]"
  ;
LAB_00112548:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,__function);
}

Assistant:

void World_3df::breed( shared_ptr<Population>&, boost::shared_ptr<Population>& dst )
{

	(*get_log()) << "Krzyżowanie...";

	/*
	 * First  ELITE_SIZE is elite, so we live it alone
	 *
	 * If crits count isn't even, we leave one out
	 */
	size_t i = dst->ELITE_SIZE;
	while(i < (dst->get_creatures().size() - 1))
	{
		double m1 = dst->get_creatures()[i]->get_fitness(), m2 = dst->get_creatures()[i + 1]->get_fitness();
		size_t xpnt = frand(CHROMSIZE - 1);
		dst->breed_creatures(i, i + 1, xpnt);

		(*get_log()) << util::logging::Msg("... [") + static_cast<long long> (i) + "]x[" + static_cast<long long> (i
				+ 1) + "]@" + static_cast<long long> (xpnt) + " = {f1: " + m1 + " -> "
				+ dst->get_creatures()[i]->get_fitness() + "}x{f2: " + m2 + " -> "
				+ dst->get_creatures()[i + 1]->get_fitness() + "}";
		i += 2;
	}

	(*get_log()) << "Już";
}